

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# saigPhase.c
# Opt level: O0

int Saig_TsiCountNonXValuedRegisters(Saig_Tsim_t *p,int nPref)

{
  int iVar1;
  uint uVar2;
  int iVar3;
  Vec_Int_t *pVVar4;
  uint *p_00;
  int local_30;
  int local_2c;
  int k;
  int i;
  int Value;
  int nRegs;
  uint *pState;
  int nPref_local;
  Saig_Tsim_t *p_local;
  
  iVar3 = p->pAig->nRegs;
  if (p->vNonXRegs != (Vec_Int_t *)0x0) {
    __assert_fail("p->vNonXRegs == NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/saig/saigPhase.c"
                  ,0xe6,"int Saig_TsiCountNonXValuedRegisters(Saig_Tsim_t *, int)");
  }
  pVVar4 = Vec_IntAlloc(10);
  p->vNonXRegs = pVVar4;
  local_2c = 0;
  do {
    local_30 = nPref;
    if (iVar3 <= local_2c) {
      iVar3 = Vec_IntSize(p->vNonXRegs);
      return iVar3;
    }
    for (; iVar1 = Vec_PtrSize(p->vStates), local_30 < iVar1; local_30 = local_30 + 1) {
      p_00 = (uint *)Vec_PtrEntry(p->vStates,local_30);
      iVar1 = Abc_InfoHasBit(p_00,local_2c * 2 + 1);
      uVar2 = Abc_InfoHasBit(p_00,local_2c << 1);
      uVar2 = iVar1 << 1 | uVar2;
      if (uVar2 == 0) {
        __assert_fail("Value != 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/saig/saigPhase.c"
                      ,0xed,"int Saig_TsiCountNonXValuedRegisters(Saig_Tsim_t *, int)");
      }
      if (uVar2 == 3) break;
    }
    iVar1 = Vec_PtrSize(p->vStates);
    if (local_30 == iVar1) {
      Vec_IntPush(p->vNonXRegs,local_2c);
    }
    local_2c = local_2c + 1;
  } while( true );
}

Assistant:

int Saig_TsiCountNonXValuedRegisters( Saig_Tsim_t * p, int nPref )
{
    unsigned * pState;
    int nRegs = p->pAig->nRegs;
    int Value, i, k;
    assert( p->vNonXRegs == NULL );
    p->vNonXRegs = Vec_IntAlloc( 10 );
    for ( i = 0; i < nRegs; i++ )
    {
        Vec_PtrForEachEntryStart( unsigned *, p->vStates, pState, k, nPref )
        {
            Value = (Abc_InfoHasBit( pState, 2 * i + 1 ) << 1) | Abc_InfoHasBit( pState, 2 * i );
            assert( Value != 0 );
            if ( Value == SAIG_XVSX )
                break;
        }
        if ( k == Vec_PtrSize(p->vStates) )
            Vec_IntPush( p->vNonXRegs, i );
    }
    return Vec_IntSize(p->vNonXRegs);
}